

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

void t51(void)

{
  int iVar1;
  undefined8 uVar2;
  ALLEGRO_USTR_INFO info;
  char str [256];
  
  uVar2 = al_ref_buffer(&info,"Allegro",3);
  al_ustr_to_buffer(uVar2,str,10);
  if (str._0_4_ == 0x6c6c41) {
    log_printf("OK   %s\n","0 == memcmp(str, \"All\", 4)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"All\", 4)");
    error = error + 1;
  }
  al_ustr_to_buffer(uVar2,str,4);
  if (str._0_4_ == 0x6c6c41) {
    log_printf("OK   %s\n","0 == memcmp(str, \"All\", 4)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"All\", 4)");
    error = error + 1;
  }
  al_ustr_to_buffer(uVar2,str,3);
  iVar1 = bcmp(str,"Al",3);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(str, \"Al\", 3)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"Al\", 3)");
    error = error + 1;
  }
  return;
}

Assistant:

static void t51(void)
{
   char str[256];
   const ALLEGRO_USTR *us;
   ALLEGRO_USTR_INFO info;

   us = al_ref_buffer(&info, "Allegro", 3);
   al_ustr_to_buffer(us, str, 10);
   CHECK(0 == memcmp(str, "All", 4));
   al_ustr_to_buffer(us, str, 4);
   CHECK(0 == memcmp(str, "All", 4));
   al_ustr_to_buffer(us, str, 3);
   CHECK(0 == memcmp(str, "Al", 3));
}